

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

void __thiscall RangeIterator::SeekBeyond(RangeIterator *this,RangeIterator_conflict *target)

{
  bool bVar1;
  S2CellId y;
  bool local_41;
  S2CellId local_38;
  S2CellId local_30;
  S2CellId local_28;
  uint64 local_20;
  RangeIterator_conflict *local_18;
  RangeIterator_conflict *target_local;
  RangeIterator_conflict *this_local;
  
  local_18 = target;
  target_local = (RangeIterator_conflict *)this;
  local_28 = range_max((RangeIterator *)target);
  local_20 = (uint64)S2CellId::next(&local_28);
  MutableS2ShapeIndex::Iterator::Seek((Iterator *)this,(S2CellId)local_20);
  bVar1 = S2ShapeIndex::IteratorBase::done((IteratorBase *)this);
  local_41 = false;
  if (!bVar1) {
    local_38 = S2ShapeIndex::IteratorBase::id((IteratorBase *)this);
    local_30 = S2CellId::range_min(&local_38);
    y = range_max((RangeIterator *)local_18);
    local_41 = operator<=(local_30,y);
  }
  if (local_41 != false) {
    MutableS2ShapeIndex::Iterator::Next((Iterator *)this);
  }
  Refresh(this);
  return;
}

Assistant:

void SeekBeyond(const RangeIterator& target) {
    it_.Seek(target.range_max().next());
    if (!it_.done() && it_.id().range_min() <= target.range_max()) {
      it_.Next();
    }
    Refresh();
  }